

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_intra_pred_luma_planar_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 *pUVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  UWORD8 UVar5;
  UWORD8 UVar6;
  UWORD8 UVar7;
  UWORD8 UVar8;
  UWORD8 UVar9;
  UWORD8 UVar10;
  UWORD8 UVar11;
  UWORD8 UVar12;
  UWORD8 *pUVar13;
  long lVar14;
  uint uVar15;
  byte *pbVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar33 [16];
  undefined1 auVar38 [16];
  undefined1 auVar46 [16];
  undefined1 auVar54 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ushort uVar75;
  short sVar76;
  ushort uVar80;
  short sVar81;
  ushort uVar82;
  short sVar83;
  ushort uVar84;
  short sVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ushort uVar89;
  undefined1 auVar79 [16];
  ushort uVar90;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  undefined1 in_XMM9 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  ushort uVar100;
  undefined1 auVar93 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  ushort uVar103;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  undefined1 auVar104 [16];
  ushort uVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  ushort uVar144;
  ushort uVar157;
  ushort uVar158;
  ushort uVar159;
  ushort uVar160;
  ushort uVar161;
  ushort uVar162;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  ushort uVar163;
  undefined1 auVar156 [16];
  short local_28;
  short sStack_26;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar47 [16];
  undefined1 auVar55 [16];
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  undefined1 auVar56 [16];
  undefined1 auVar41 [16];
  undefined1 auVar49 [16];
  undefined1 auVar57 [16];
  undefined1 auVar42 [16];
  undefined1 auVar50 [16];
  undefined1 auVar58 [16];
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar59 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  undefined1 auVar45 [16];
  undefined1 auVar53 [16];
  undefined1 auVar61 [16];
  short sVar62;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  undefined1 auVar114 [16];
  undefined1 auVar123 [16];
  undefined1 auVar115 [16];
  undefined1 auVar124 [16];
  undefined1 auVar116 [16];
  undefined1 auVar125 [16];
  undefined1 auVar117 [16];
  undefined1 auVar126 [16];
  undefined1 auVar118 [16];
  undefined1 auVar127 [16];
  undefined1 auVar119 [16];
  undefined1 auVar128 [16];
  undefined1 auVar120 [16];
  undefined1 auVar129 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  
  uVar4 = nt * 2;
  lVar14 = (long)nt;
  bVar2 = pu1_ref[lVar14 + -1];
  bVar3 = pu1_ref[lVar14 * 3 + 1];
  auVar22 = ZEXT216(CONCAT11(bVar2,bVar3));
  auVar22 = pshuflw(auVar22,auVar22,0);
  uVar21 = auVar22._0_4_;
  auVar29._4_4_ = uVar21;
  auVar29._0_4_ = uVar21;
  auVar29._8_4_ = uVar21;
  auVar29._12_4_ = uVar21;
  auVar22 = pshuflw(ZEXT416((uint)nt),ZEXT416((uint)nt),0);
  local_28 = auVar22._0_2_;
  sStack_26 = auVar22._2_2_;
  if (nt == 0x20) {
    uVar18 = (ulong)uVar4;
    pUVar13 = pu1_dst + 0x10;
    auVar132 = pmovsxbw(in_XMM9,0x1818181818181818);
    lVar14 = 0x20;
    auVar22 = _DAT_0016bf10;
    auVar112 = _DAT_0016be30;
    while (lVar14 != 0) {
      auVar130 = pshufb(ZEXT116(pu1_ref[lVar14 + (uVar18 - 0x21)]),(undefined1  [16])0x0);
      sVar76 = auVar22._0_2_;
      auVar78._0_2_ = sVar76 + -8;
      sVar81 = auVar22._2_2_;
      auVar78._2_2_ = sVar81 + -8;
      sVar83 = auVar22._4_2_;
      auVar78._4_2_ = sVar83 + -8;
      sVar85 = auVar22._6_2_;
      auVar78._6_2_ = sVar85 + -8;
      sVar25 = auVar22._8_2_;
      auVar78._8_2_ = sVar25 + -8;
      sVar26 = auVar22._10_2_;
      auVar78._10_2_ = sVar26 + -8;
      sVar27 = auVar22._12_2_;
      sVar28 = auVar22._14_2_;
      auVar78._12_2_ = sVar27 + -8;
      auVar78._14_2_ = sVar28 + -8;
      sVar62 = auVar112._0_2_;
      auVar143._0_2_ = sVar62 + 8;
      sVar66 = auVar112._2_2_;
      auVar143._2_2_ = sVar66 + 8;
      sVar67 = auVar112._4_2_;
      auVar143._4_2_ = sVar67 + 8;
      sVar68 = auVar112._6_2_;
      auVar143._6_2_ = sVar68 + 8;
      sVar69 = auVar112._8_2_;
      auVar143._8_2_ = sVar69 + 8;
      sVar70 = auVar112._10_2_;
      auVar143._10_2_ = sVar70 + 8;
      sVar71 = auVar112._12_2_;
      sVar72 = auVar112._14_2_;
      auVar143._12_2_ = sVar71 + 8;
      auVar143._14_2_ = sVar72 + 8;
      auVar101._0_2_ = sVar76 + -0x10;
      auVar101._2_2_ = sVar81 + -0x10;
      auVar101._4_2_ = sVar83 + -0x10;
      auVar101._6_2_ = sVar85 + -0x10;
      auVar101._8_2_ = sVar25 + -0x10;
      auVar101._10_2_ = sVar26 + -0x10;
      auVar101._12_2_ = sVar27 + -0x10;
      auVar101._14_2_ = sVar28 + -0x10;
      auVar145._0_2_ = sVar62 + 0x10;
      auVar145._2_2_ = sVar66 + 0x10;
      auVar145._4_2_ = sVar67 + 0x10;
      auVar145._6_2_ = sVar68 + 0x10;
      auVar145._8_2_ = sVar69 + 0x10;
      auVar145._10_2_ = sVar70 + 0x10;
      auVar145._12_2_ = sVar71 + 0x10;
      auVar145._14_2_ = sVar72 + 0x10;
      pUVar1 = pu1_ref + uVar18 + 1;
      auVar61._0_14_ = auVar130._0_14_;
      auVar61[0xe] = auVar130[7];
      auVar61[0xf] = pUVar1[7];
      auVar60._14_2_ = auVar61._14_2_;
      auVar60._0_13_ = auVar130._0_13_;
      auVar60[0xd] = pUVar1[6];
      auVar59._13_3_ = auVar60._13_3_;
      auVar59._0_12_ = auVar130._0_12_;
      auVar59[0xc] = auVar130[6];
      auVar58._12_4_ = auVar59._12_4_;
      auVar58._0_11_ = auVar130._0_11_;
      auVar58[0xb] = pUVar1[5];
      auVar57._11_5_ = auVar58._11_5_;
      auVar57._0_10_ = auVar130._0_10_;
      auVar57[10] = auVar130[5];
      auVar56._10_6_ = auVar57._10_6_;
      auVar56._0_9_ = auVar130._0_9_;
      auVar56[9] = pUVar1[4];
      auVar55._9_7_ = auVar56._9_7_;
      auVar55._0_8_ = auVar130._0_8_;
      auVar55[8] = auVar130[4];
      auVar54._8_8_ = auVar55._8_8_;
      auVar54[7] = pUVar1[3];
      auVar54[6] = auVar130[3];
      auVar54[5] = pUVar1[2];
      auVar54[4] = auVar130[2];
      auVar54[3] = pUVar1[1];
      auVar54[2] = auVar130[1];
      auVar54[0] = auVar130[0];
      auVar54[1] = *pUVar1;
      auVar156[1] = pUVar1[8];
      auVar156[0] = auVar130[8];
      auVar156[2] = auVar130[9];
      auVar156[3] = pUVar1[9];
      auVar156[4] = auVar130[10];
      auVar156[5] = pUVar1[10];
      auVar156[6] = auVar130[0xb];
      auVar156[7] = pUVar1[0xb];
      auVar156[8] = auVar130[0xc];
      auVar156[9] = pUVar1[0xc];
      auVar156[10] = auVar130[0xd];
      auVar156[0xb] = pUVar1[0xd];
      auVar156[0xc] = auVar130[0xe];
      auVar156[0xd] = pUVar1[0xe];
      auVar156[0xe] = auVar130[0xf];
      auVar156[0xf] = pUVar1[0xf];
      pUVar1 = pu1_ref + uVar18 + 0x11;
      auVar156 = pmaddubsw(auVar156,auVar78);
      auVar37[0xe] = auVar130[7];
      auVar37._0_14_ = auVar61._0_14_;
      auVar37[0xf] = pUVar1[7];
      auVar36._14_2_ = auVar37._14_2_;
      auVar36[0xd] = pUVar1[6];
      auVar36._0_13_ = auVar60._0_13_;
      auVar35._13_3_ = auVar36._13_3_;
      auVar35[0xc] = auVar130[6];
      auVar35._0_12_ = auVar59._0_12_;
      auVar34._12_4_ = auVar35._12_4_;
      auVar34[0xb] = pUVar1[5];
      auVar34._0_11_ = auVar58._0_11_;
      auVar33._11_5_ = auVar34._11_5_;
      auVar33[10] = auVar130[5];
      auVar33._0_10_ = auVar57._0_10_;
      auVar154._10_6_ = auVar33._10_6_;
      auVar154[9] = pUVar1[4];
      auVar154._0_9_ = auVar56._0_9_;
      auVar121._9_7_ = auVar154._9_7_;
      auVar121[8] = auVar130[4];
      auVar121._0_8_ = auVar55._0_8_;
      auVar141._8_8_ = auVar121._8_8_;
      auVar141[7] = pUVar1[3];
      auVar141[6] = auVar130[3];
      auVar141[5] = pUVar1[2];
      auVar141[4] = auVar130[2];
      auVar141[3] = pUVar1[1];
      auVar141[2] = auVar130[1];
      auVar141[1] = *pUVar1;
      auVar141[0] = auVar54[0];
      auVar78 = pmaddubsw(auVar141,auVar101);
      auVar102._0_2_ = sVar76 + -0x18;
      auVar102._2_2_ = sVar81 + -0x18;
      auVar102._4_2_ = sVar83 + -0x18;
      auVar102._6_2_ = sVar85 + -0x18;
      auVar102._8_2_ = sVar25 + -0x18;
      auVar102._10_2_ = sVar26 + -0x18;
      auVar102._12_2_ = sVar27 + -0x18;
      auVar102._14_2_ = sVar28 + -0x18;
      auVar131[1] = pUVar1[8];
      auVar131[0] = auVar130[8];
      auVar131[2] = auVar130[9];
      auVar131[3] = pUVar1[9];
      auVar131[4] = auVar130[10];
      auVar131[5] = pUVar1[10];
      auVar131[6] = auVar130[0xb];
      auVar131[7] = pUVar1[0xb];
      auVar131[8] = auVar130[0xc];
      auVar131[9] = pUVar1[0xc];
      auVar131[10] = auVar130[0xd];
      auVar131[0xb] = pUVar1[0xd];
      auVar131[0xc] = auVar130[0xe];
      auVar131[0xd] = pUVar1[0xe];
      auVar131[0xe] = auVar130[0xf];
      auVar131[0xf] = pUVar1[0xf];
      auVar130._0_2_ = sVar62 + auVar132._0_2_;
      auVar130._2_2_ = sVar66 + auVar132._2_2_;
      auVar130._4_2_ = sVar67 + auVar132._4_2_;
      auVar130._6_2_ = sVar68 + auVar132._6_2_;
      auVar130._8_2_ = sVar69 + auVar132._8_2_;
      auVar130._10_2_ = sVar70 + auVar132._10_2_;
      auVar130._12_2_ = sVar71 + auVar132._12_2_;
      auVar130._14_2_ = sVar72 + auVar132._14_2_;
      auVar141 = pmaddubsw(auVar131,auVar102);
      auVar121 = pmaddubsw(auVar29,auVar143);
      auVar154 = pmaddubsw(auVar29,auVar145);
      auVar145 = pmaddubsw(auVar29,auVar130);
      auVar112 = pmaddubsw(auVar29,auVar112);
      auVar22 = pmaddubsw(auVar54,auVar22);
      uVar75 = (ushort)(auVar112._0_2_ + local_28 + auVar22._0_2_) >> 6;
      uVar80 = (ushort)(auVar112._2_2_ + sStack_26 + auVar22._2_2_) >> 6;
      uVar82 = (ushort)(auVar112._4_2_ + local_28 + auVar22._4_2_) >> 6;
      uVar84 = (ushort)(auVar112._6_2_ + sStack_26 + auVar22._6_2_) >> 6;
      uVar86 = (ushort)(auVar112._8_2_ + local_28 + auVar22._8_2_) >> 6;
      uVar87 = (ushort)(auVar112._10_2_ + sStack_26 + auVar22._10_2_) >> 6;
      uVar88 = (ushort)(auVar112._12_2_ + local_28 + auVar22._12_2_) >> 6;
      uVar89 = (ushort)(auVar112._14_2_ + sStack_26 + auVar22._14_2_) >> 6;
      uVar103 = (ushort)(auVar121._0_2_ + local_28 + auVar156._0_2_) >> 6;
      uVar105 = (ushort)(auVar121._2_2_ + sStack_26 + auVar156._2_2_) >> 6;
      uVar106 = (ushort)(auVar121._4_2_ + local_28 + auVar156._4_2_) >> 6;
      uVar107 = (ushort)(auVar121._6_2_ + sStack_26 + auVar156._6_2_) >> 6;
      uVar108 = (ushort)(auVar121._8_2_ + local_28 + auVar156._8_2_) >> 6;
      uVar109 = (ushort)(auVar121._10_2_ + sStack_26 + auVar156._10_2_) >> 6;
      uVar110 = (ushort)(auVar121._12_2_ + local_28 + auVar156._12_2_) >> 6;
      uVar111 = (ushort)(auVar121._14_2_ + sStack_26 + auVar156._14_2_) >> 6;
      uVar144 = (ushort)(auVar154._0_2_ + local_28 + auVar78._0_2_) >> 6;
      uVar157 = (ushort)(auVar154._2_2_ + sStack_26 + auVar78._2_2_) >> 6;
      uVar158 = (ushort)(auVar154._4_2_ + local_28 + auVar78._4_2_) >> 6;
      uVar159 = (ushort)(auVar154._6_2_ + sStack_26 + auVar78._6_2_) >> 6;
      uVar160 = (ushort)(auVar154._8_2_ + local_28 + auVar78._8_2_) >> 6;
      uVar161 = (ushort)(auVar154._10_2_ + sStack_26 + auVar78._10_2_) >> 6;
      uVar162 = (ushort)(auVar154._12_2_ + local_28 + auVar78._12_2_) >> 6;
      uVar163 = (ushort)(auVar154._14_2_ + sStack_26 + auVar78._14_2_) >> 6;
      uVar90 = (ushort)(auVar145._0_2_ + local_28 + auVar141._0_2_) >> 6;
      uVar94 = (ushort)(auVar145._2_2_ + sStack_26 + auVar141._2_2_) >> 6;
      uVar95 = (ushort)(auVar145._4_2_ + local_28 + auVar141._4_2_) >> 6;
      uVar96 = (ushort)(auVar145._6_2_ + sStack_26 + auVar141._6_2_) >> 6;
      uVar97 = (ushort)(auVar145._8_2_ + local_28 + auVar141._8_2_) >> 6;
      uVar98 = (ushort)(auVar145._10_2_ + sStack_26 + auVar141._10_2_) >> 6;
      uVar99 = (ushort)(auVar145._12_2_ + local_28 + auVar141._12_2_) >> 6;
      uVar100 = (ushort)(auVar145._14_2_ + sStack_26 + auVar141._14_2_) >> 6;
      pUVar13[-0x10] = (uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 - (0xff < uVar75);
      pUVar13[-0xf] = (uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 - (0xff < uVar80);
      pUVar13[-0xe] = (uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 - (0xff < uVar82);
      pUVar13[-0xd] = (uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84);
      pUVar13[-0xc] = (uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 - (0xff < uVar86);
      pUVar13[-0xb] = (uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87);
      pUVar13[-10] = (uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88);
      pUVar13[-9] = (uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89);
      pUVar13[-8] = (uVar103 != 0) * (uVar103 < 0x100) * (char)uVar103 - (0xff < uVar103);
      pUVar13[-7] = (uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105);
      pUVar13[-6] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
      pUVar13[-5] = (uVar107 != 0) * (uVar107 < 0x100) * (char)uVar107 - (0xff < uVar107);
      pUVar13[-4] = (uVar108 != 0) * (uVar108 < 0x100) * (char)uVar108 - (0xff < uVar108);
      pUVar13[-3] = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
      pUVar13[-2] = (uVar110 != 0) * (uVar110 < 0x100) * (char)uVar110 - (0xff < uVar110);
      pUVar13[-1] = (uVar111 != 0) * (uVar111 < 0x100) * (char)uVar111 - (0xff < uVar111);
      *pUVar13 = (uVar144 != 0) * (uVar144 < 0x100) * (char)uVar144 - (0xff < uVar144);
      pUVar13[1] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
      pUVar13[2] = (uVar158 != 0) * (uVar158 < 0x100) * (char)uVar158 - (0xff < uVar158);
      pUVar13[3] = (uVar159 != 0) * (uVar159 < 0x100) * (char)uVar159 - (0xff < uVar159);
      pUVar13[4] = (uVar160 != 0) * (uVar160 < 0x100) * (char)uVar160 - (0xff < uVar160);
      pUVar13[5] = (uVar161 != 0) * (uVar161 < 0x100) * (char)uVar161 - (0xff < uVar161);
      pUVar13[6] = (uVar162 != 0) * (uVar162 < 0x100) * (char)uVar162 - (0xff < uVar162);
      pUVar13[7] = (uVar163 != 0) * (uVar163 < 0x100) * (char)uVar163 - (0xff < uVar163);
      pUVar13[8] = (uVar90 != 0) * (uVar90 < 0x100) * (char)uVar90 - (0xff < uVar90);
      pUVar13[9] = (uVar94 != 0) * (uVar94 < 0x100) * (char)uVar94 - (0xff < uVar94);
      pUVar13[10] = (uVar95 != 0) * (uVar95 < 0x100) * (char)uVar95 - (0xff < uVar95);
      pUVar13[0xb] = (uVar96 != 0) * (uVar96 < 0x100) * (char)uVar96 - (0xff < uVar96);
      pUVar13[0xc] = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
      pUVar13[0xd] = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
      pUVar13[0xe] = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
      pUVar13[0xf] = (uVar100 != 0) * (uVar100 < 0x100) * (char)uVar100 - (0xff < uVar100);
      auVar22._0_2_ = sVar76 + -0x100;
      auVar22._2_2_ = sVar81 + -0x100;
      auVar22._4_2_ = sVar83 + -0x100;
      auVar22._6_2_ = sVar85 + -0x100;
      auVar22._8_2_ = sVar25 + -0x100;
      auVar22._10_2_ = sVar26 + -0x100;
      auVar22._12_2_ = sVar27 + -0x100;
      auVar22._14_2_ = sVar28 + -0x100;
      auVar112._0_2_ = sVar62 + 0x100;
      auVar112._2_2_ = sVar66 + 0x100;
      auVar112._4_2_ = sVar67 + 0x100;
      auVar112._6_2_ = sVar68 + 0x100;
      auVar112._8_2_ = sVar69 + 0x100;
      auVar112._10_2_ = sVar70 + 0x100;
      auVar112._12_2_ = sVar71 + 0x100;
      auVar112._14_2_ = sVar72 + 0x100;
      pUVar13 = pUVar13 + dst_strd;
      lVar14 = lVar14 + -1;
    }
  }
  else if (nt == 0x10) {
    pbVar16 = pu1_ref + ((ulong)uVar4 - 1);
    auVar132 = _DAT_0016bec0;
    auVar74 = _DAT_0016be30;
    uVar15 = uVar4;
    for (uVar18 = 0; uVar15 = uVar15 - 2, uVar18 < 0x10; uVar18 = uVar18 + 2) {
      auVar22 = pshufb(ZEXT116(*pbVar16),(undefined1  [16])0x0);
      auVar78 = pshufb(ZEXT116(pu1_ref[uVar15]),(undefined1  [16])0x0);
      sVar62 = auVar132._0_2_;
      auVar91._0_2_ = sVar62 + -0x100;
      sVar66 = auVar132._2_2_;
      auVar91._2_2_ = sVar66 + -0x100;
      sVar67 = auVar132._4_2_;
      auVar91._4_2_ = sVar67 + -0x100;
      sVar68 = auVar132._6_2_;
      auVar91._6_2_ = sVar68 + -0x100;
      sVar69 = auVar132._8_2_;
      auVar91._8_2_ = sVar69 + -0x100;
      sVar70 = auVar132._10_2_;
      auVar91._10_2_ = sVar70 + -0x100;
      sVar71 = auVar132._12_2_;
      sVar72 = auVar132._14_2_;
      auVar91._12_2_ = sVar71 + -0x100;
      auVar91._14_2_ = sVar72 + -0x100;
      sVar76 = auVar74._0_2_;
      auVar32._0_2_ = sVar76 + 0x100;
      sVar81 = auVar74._2_2_;
      auVar32._2_2_ = sVar81 + 0x100;
      sVar83 = auVar74._4_2_;
      auVar32._4_2_ = sVar83 + 0x100;
      sVar85 = auVar74._6_2_;
      auVar32._6_2_ = sVar85 + 0x100;
      sVar25 = auVar74._8_2_;
      auVar32._8_2_ = sVar25 + 0x100;
      sVar26 = auVar74._10_2_;
      auVar32._10_2_ = sVar26 + 0x100;
      sVar27 = auVar74._12_2_;
      sVar28 = auVar74._14_2_;
      auVar32._12_2_ = sVar27 + 0x100;
      auVar32._14_2_ = sVar28 + 0x100;
      auVar155._0_2_ = sVar62 + -8;
      auVar155._2_2_ = sVar66 + -8;
      auVar155._4_2_ = sVar67 + -8;
      auVar155._6_2_ = sVar68 + -8;
      auVar155._8_2_ = sVar69 + -8;
      auVar155._10_2_ = sVar70 + -8;
      auVar155._12_2_ = sVar71 + -8;
      auVar155._14_2_ = sVar72 + -8;
      auVar24._0_2_ = sVar76 + 8;
      auVar24._2_2_ = sVar81 + 8;
      auVar24._4_2_ = sVar83 + 8;
      auVar24._6_2_ = sVar85 + 8;
      auVar24._8_2_ = sVar25 + 8;
      auVar24._10_2_ = sVar26 + 8;
      auVar24._12_2_ = sVar27 + 8;
      auVar24._14_2_ = sVar28 + 8;
      pUVar13 = pu1_ref + (ulong)uVar4 + 1;
      auVar53._0_14_ = auVar78._0_14_;
      auVar53[0xe] = auVar78[7];
      auVar53[0xf] = pUVar13[7];
      auVar52._14_2_ = auVar53._14_2_;
      auVar52._0_13_ = auVar78._0_13_;
      auVar52[0xd] = pUVar13[6];
      auVar51._13_3_ = auVar52._13_3_;
      auVar51._0_12_ = auVar78._0_12_;
      auVar51[0xc] = auVar78[6];
      auVar50._12_4_ = auVar51._12_4_;
      auVar50._0_11_ = auVar78._0_11_;
      auVar50[0xb] = pUVar13[5];
      auVar49._11_5_ = auVar50._11_5_;
      auVar49._0_10_ = auVar78._0_10_;
      auVar49[10] = auVar78[5];
      auVar48._10_6_ = auVar49._10_6_;
      auVar48._0_9_ = auVar78._0_9_;
      auVar48[9] = pUVar13[4];
      auVar47._9_7_ = auVar48._9_7_;
      auVar47._0_8_ = auVar78._0_8_;
      auVar47[8] = auVar78[4];
      auVar46._8_8_ = auVar47._8_8_;
      auVar46[7] = pUVar13[3];
      auVar46[6] = auVar78[3];
      auVar46[5] = pUVar13[2];
      auVar46[4] = auVar78[2];
      auVar46[3] = pUVar13[1];
      auVar46[2] = auVar78[1];
      auVar46[0] = auVar78[0];
      auVar46[1] = *pUVar13;
      auVar112 = pmaddubsw(auVar46,auVar91);
      auVar65[1] = pUVar13[8];
      auVar65[0] = auVar22[8];
      auVar65[2] = auVar22[9];
      auVar65[3] = pUVar13[9];
      auVar65[4] = auVar22[10];
      auVar65[5] = pUVar13[10];
      auVar65[6] = auVar22[0xb];
      auVar65[7] = pUVar13[0xb];
      auVar65[8] = auVar22[0xc];
      auVar65[9] = pUVar13[0xc];
      auVar65[10] = auVar22[0xd];
      auVar65[0xb] = pUVar13[0xd];
      auVar65[0xc] = auVar22[0xe];
      auVar65[0xd] = pUVar13[0xe];
      auVar65[0xe] = auVar22[0xf];
      auVar65[0xf] = pUVar13[0xf];
      auVar145 = pmaddubsw(auVar65,auVar155);
      auVar92._0_2_ = sVar62 + -0x108;
      auVar92._2_2_ = sVar66 + -0x108;
      auVar92._4_2_ = sVar67 + -0x108;
      auVar92._6_2_ = sVar68 + -0x108;
      auVar92._8_2_ = sVar69 + -0x108;
      auVar92._10_2_ = sVar70 + -0x108;
      auVar92._12_2_ = sVar71 + -0x108;
      auVar92._14_2_ = sVar72 + -0x108;
      auVar129._0_14_ = auVar22._0_14_;
      auVar129[0xe] = auVar22[7];
      auVar129[0xf] = pUVar13[7];
      auVar128._14_2_ = auVar129._14_2_;
      auVar128._0_13_ = auVar22._0_13_;
      auVar128[0xd] = pUVar13[6];
      auVar127._13_3_ = auVar128._13_3_;
      auVar127._0_12_ = auVar22._0_12_;
      auVar127[0xc] = auVar22[6];
      auVar126._12_4_ = auVar127._12_4_;
      auVar126._0_11_ = auVar22._0_11_;
      auVar126[0xb] = pUVar13[5];
      auVar125._11_5_ = auVar126._11_5_;
      auVar125._0_10_ = auVar22._0_10_;
      auVar125[10] = auVar22[5];
      auVar124._10_6_ = auVar125._10_6_;
      auVar124._0_9_ = auVar22._0_9_;
      auVar124[9] = pUVar13[4];
      auVar123._9_7_ = auVar124._9_7_;
      auVar123._0_8_ = auVar22._0_8_;
      auVar123[8] = auVar22[4];
      auVar122._8_8_ = auVar123._8_8_;
      auVar122[7] = pUVar13[3];
      auVar122[6] = auVar22[3];
      auVar122[5] = pUVar13[2];
      auVar122[4] = auVar22[2];
      auVar122[3] = pUVar13[1];
      auVar122[2] = auVar22[1];
      auVar122[0] = auVar22[0];
      auVar122[1] = *pUVar13;
      auVar142[1] = pUVar13[8];
      auVar142[0] = auVar78[8];
      auVar142[2] = auVar78[9];
      auVar142[3] = pUVar13[9];
      auVar142[4] = auVar78[10];
      auVar142[5] = pUVar13[10];
      auVar142[6] = auVar78[0xb];
      auVar142[7] = pUVar13[0xb];
      auVar142[8] = auVar78[0xc];
      auVar142[9] = pUVar13[0xc];
      auVar142[10] = auVar78[0xd];
      auVar142[0xb] = pUVar13[0xd];
      auVar142[0xc] = auVar78[0xe];
      auVar142[0xd] = pUVar13[0xe];
      auVar142[0xe] = auVar78[0xf];
      auVar142[0xf] = pUVar13[0xf];
      auVar79._0_2_ = sVar76 + 0x108;
      auVar79._2_2_ = sVar81 + 0x108;
      auVar79._4_2_ = sVar83 + 0x108;
      auVar79._6_2_ = sVar85 + 0x108;
      auVar79._8_2_ = sVar25 + 0x108;
      auVar79._10_2_ = sVar26 + 0x108;
      auVar79._12_2_ = sVar27 + 0x108;
      auVar79._14_2_ = sVar28 + 0x108;
      auVar141 = pmaddubsw(auVar142,auVar92);
      auVar154 = pmaddubsw(auVar29,auVar32);
      auVar121 = pmaddubsw(auVar29,auVar24);
      auVar22 = pmaddubsw(auVar29,auVar79);
      auVar78 = pmaddubsw(auVar29,auVar74);
      auVar132 = pmaddubsw(auVar122,auVar132);
      uVar90 = (ushort)(auVar78._0_2_ + local_28 + auVar132._0_2_) >> 5;
      uVar94 = (ushort)(auVar78._2_2_ + sStack_26 + auVar132._2_2_) >> 5;
      uVar95 = (ushort)(auVar78._4_2_ + local_28 + auVar132._4_2_) >> 5;
      uVar96 = (ushort)(auVar78._6_2_ + sStack_26 + auVar132._6_2_) >> 5;
      uVar97 = (ushort)(auVar78._8_2_ + local_28 + auVar132._8_2_) >> 5;
      uVar98 = (ushort)(auVar78._10_2_ + sStack_26 + auVar132._10_2_) >> 5;
      uVar99 = (ushort)(auVar78._12_2_ + local_28 + auVar132._12_2_) >> 5;
      uVar100 = (ushort)(auVar78._14_2_ + sStack_26 + auVar132._14_2_) >> 5;
      uVar103 = (ushort)(auVar121._0_2_ + local_28 + auVar145._0_2_) >> 5;
      uVar105 = (ushort)(auVar121._2_2_ + sStack_26 + auVar145._2_2_) >> 5;
      uVar106 = (ushort)(auVar121._4_2_ + local_28 + auVar145._4_2_) >> 5;
      uVar107 = (ushort)(auVar121._6_2_ + sStack_26 + auVar145._6_2_) >> 5;
      uVar108 = (ushort)(auVar121._8_2_ + local_28 + auVar145._8_2_) >> 5;
      uVar109 = (ushort)(auVar121._10_2_ + sStack_26 + auVar145._10_2_) >> 5;
      uVar110 = (ushort)(auVar121._12_2_ + local_28 + auVar145._12_2_) >> 5;
      uVar111 = (ushort)(auVar121._14_2_ + sStack_26 + auVar145._14_2_) >> 5;
      uVar144 = (ushort)(auVar154._0_2_ + local_28 + auVar112._0_2_) >> 5;
      uVar157 = (ushort)(auVar154._2_2_ + sStack_26 + auVar112._2_2_) >> 5;
      uVar158 = (ushort)(auVar154._4_2_ + local_28 + auVar112._4_2_) >> 5;
      uVar159 = (ushort)(auVar154._6_2_ + sStack_26 + auVar112._6_2_) >> 5;
      uVar160 = (ushort)(auVar154._8_2_ + local_28 + auVar112._8_2_) >> 5;
      uVar161 = (ushort)(auVar154._10_2_ + sStack_26 + auVar112._10_2_) >> 5;
      uVar162 = (ushort)(auVar154._12_2_ + local_28 + auVar112._12_2_) >> 5;
      uVar163 = (ushort)(auVar154._14_2_ + sStack_26 + auVar112._14_2_) >> 5;
      uVar75 = (ushort)(auVar22._0_2_ + local_28 + auVar141._0_2_) >> 5;
      uVar80 = (ushort)(auVar22._2_2_ + sStack_26 + auVar141._2_2_) >> 5;
      uVar82 = (ushort)(auVar22._4_2_ + local_28 + auVar141._4_2_) >> 5;
      uVar84 = (ushort)(auVar22._6_2_ + sStack_26 + auVar141._6_2_) >> 5;
      uVar86 = (ushort)(auVar22._8_2_ + local_28 + auVar141._8_2_) >> 5;
      uVar87 = (ushort)(auVar22._10_2_ + sStack_26 + auVar141._10_2_) >> 5;
      uVar88 = (ushort)(auVar22._12_2_ + local_28 + auVar141._12_2_) >> 5;
      uVar89 = (ushort)(auVar22._14_2_ + sStack_26 + auVar141._14_2_) >> 5;
      *pu1_dst = (uVar90 != 0) * (uVar90 < 0x100) * (char)uVar90 - (0xff < uVar90);
      pu1_dst[1] = (uVar94 != 0) * (uVar94 < 0x100) * (char)uVar94 - (0xff < uVar94);
      pu1_dst[2] = (uVar95 != 0) * (uVar95 < 0x100) * (char)uVar95 - (0xff < uVar95);
      pu1_dst[3] = (uVar96 != 0) * (uVar96 < 0x100) * (char)uVar96 - (0xff < uVar96);
      pu1_dst[4] = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
      pu1_dst[5] = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
      pu1_dst[6] = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
      pu1_dst[7] = (uVar100 != 0) * (uVar100 < 0x100) * (char)uVar100 - (0xff < uVar100);
      pu1_dst[8] = (uVar103 != 0) * (uVar103 < 0x100) * (char)uVar103 - (0xff < uVar103);
      pu1_dst[9] = (uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105);
      pu1_dst[10] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
      pu1_dst[0xb] = (uVar107 != 0) * (uVar107 < 0x100) * (char)uVar107 - (0xff < uVar107);
      pu1_dst[0xc] = (uVar108 != 0) * (uVar108 < 0x100) * (char)uVar108 - (0xff < uVar108);
      pu1_dst[0xd] = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
      pu1_dst[0xe] = (uVar110 != 0) * (uVar110 < 0x100) * (char)uVar110 - (0xff < uVar110);
      pu1_dst[0xf] = (uVar111 != 0) * (uVar111 < 0x100) * (char)uVar111 - (0xff < uVar111);
      pUVar13 = pu1_dst + dst_strd;
      *pUVar13 = (uVar144 != 0) * (uVar144 < 0x100) * (char)uVar144 - (0xff < uVar144);
      pUVar13[1] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
      pUVar13[2] = (uVar158 != 0) * (uVar158 < 0x100) * (char)uVar158 - (0xff < uVar158);
      pUVar13[3] = (uVar159 != 0) * (uVar159 < 0x100) * (char)uVar159 - (0xff < uVar159);
      pUVar13[4] = (uVar160 != 0) * (uVar160 < 0x100) * (char)uVar160 - (0xff < uVar160);
      pUVar13[5] = (uVar161 != 0) * (uVar161 < 0x100) * (char)uVar161 - (0xff < uVar161);
      pUVar13[6] = (uVar162 != 0) * (uVar162 < 0x100) * (char)uVar162 - (0xff < uVar162);
      pUVar13[7] = (uVar163 != 0) * (uVar163 < 0x100) * (char)uVar163 - (0xff < uVar163);
      pUVar13[8] = (uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 - (0xff < uVar75);
      pUVar13[9] = (uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 - (0xff < uVar80);
      pUVar13[10] = (uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 - (0xff < uVar82);
      pUVar13[0xb] = (uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84);
      pUVar13[0xc] = (uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 - (0xff < uVar86);
      pUVar13[0xd] = (uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87);
      pUVar13[0xe] = (uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88);
      pUVar13[0xf] = (uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89);
      auVar132._0_2_ = sVar62 + -0x200;
      auVar132._2_2_ = sVar66 + -0x200;
      auVar132._4_2_ = sVar67 + -0x200;
      auVar132._6_2_ = sVar68 + -0x200;
      auVar132._8_2_ = sVar69 + -0x200;
      auVar132._10_2_ = sVar70 + -0x200;
      auVar132._12_2_ = sVar71 + -0x200;
      auVar132._14_2_ = sVar72 + -0x200;
      auVar74._0_2_ = sVar76 + 0x200;
      auVar74._2_2_ = sVar81 + 0x200;
      auVar74._4_2_ = sVar83 + 0x200;
      auVar74._6_2_ = sVar85 + 0x200;
      auVar74._8_2_ = sVar25 + 0x200;
      auVar74._10_2_ = sVar26 + 0x200;
      auVar74._12_2_ = sVar27 + 0x200;
      auVar74._14_2_ = sVar28 + 0x200;
      pu1_dst = pu1_dst + (long)dst_strd * 2;
      pbVar16 = pbVar16 + -2;
    }
  }
  else if (nt == 8) {
    lVar14 = (long)dst_strd;
    pbVar16 = pu1_ref + ((ulong)uVar4 - 1);
    auVar30 = _DAT_0016be20;
    auVar31 = _DAT_0016be30;
    uVar15 = uVar4;
    for (uVar18 = 0; uVar18 < 8; uVar18 = uVar18 + 4) {
      auVar112 = pshufb(ZEXT116(*pbVar16),(undefined1  [16])0x0);
      auVar132 = pshufb(ZEXT116(pu1_ref[uVar15 - 2]),(undefined1  [16])0x0);
      auVar145 = pshufb(ZEXT116(pu1_ref[uVar15 - 3]),(undefined1  [16])0x0);
      auVar22 = pshufb(ZEXT116(pu1_ref[uVar15 - 4]),(undefined1  [16])0x0);
      sVar62 = auVar30._0_2_;
      auVar63._0_2_ = sVar62 + -0x100;
      sVar66 = auVar30._2_2_;
      auVar63._2_2_ = sVar66 + -0x100;
      sVar67 = auVar30._4_2_;
      auVar63._4_2_ = sVar67 + -0x100;
      sVar68 = auVar30._6_2_;
      auVar63._6_2_ = sVar68 + -0x100;
      sVar69 = auVar30._8_2_;
      auVar63._8_2_ = sVar69 + -0x100;
      sVar70 = auVar30._10_2_;
      auVar63._10_2_ = sVar70 + -0x100;
      sVar71 = auVar30._12_2_;
      sVar72 = auVar30._14_2_;
      auVar63._12_2_ = sVar71 + -0x100;
      auVar63._14_2_ = sVar72 + -0x100;
      sVar76 = auVar31._0_2_;
      auVar23._0_2_ = sVar76 + 0x100;
      sVar81 = auVar31._2_2_;
      auVar23._2_2_ = sVar81 + 0x100;
      sVar83 = auVar31._4_2_;
      auVar23._4_2_ = sVar83 + 0x100;
      sVar85 = auVar31._6_2_;
      auVar23._6_2_ = sVar85 + 0x100;
      sVar25 = auVar31._8_2_;
      auVar23._8_2_ = sVar25 + 0x100;
      sVar26 = auVar31._10_2_;
      auVar23._10_2_ = sVar26 + 0x100;
      sVar27 = auVar31._12_2_;
      sVar28 = auVar31._14_2_;
      auVar23._12_2_ = sVar27 + 0x100;
      auVar23._14_2_ = sVar28 + 0x100;
      auVar73._0_2_ = sVar62 + -0x200;
      auVar73._2_2_ = sVar66 + -0x200;
      auVar73._4_2_ = sVar67 + -0x200;
      auVar73._6_2_ = sVar68 + -0x200;
      auVar73._8_2_ = sVar69 + -0x200;
      auVar73._10_2_ = sVar70 + -0x200;
      auVar73._12_2_ = sVar71 + -0x200;
      auVar73._14_2_ = sVar72 + -0x200;
      pUVar13 = pu1_ref + (ulong)uVar4 + 1;
      UVar5 = *pUVar13;
      UVar6 = pUVar13[1];
      UVar7 = pUVar13[2];
      UVar8 = pUVar13[3];
      UVar9 = pUVar13[4];
      UVar10 = pUVar13[5];
      UVar11 = pUVar13[6];
      UVar12 = pUVar13[7];
      auVar140._0_14_ = auVar132._0_14_;
      auVar140[0xe] = auVar132[7];
      auVar140[0xf] = UVar12;
      auVar139._14_2_ = auVar140._14_2_;
      auVar139._0_13_ = auVar132._0_13_;
      auVar139[0xd] = UVar11;
      auVar138._13_3_ = auVar139._13_3_;
      auVar138._0_12_ = auVar132._0_12_;
      auVar138[0xc] = auVar132[6];
      auVar137._12_4_ = auVar138._12_4_;
      auVar137._0_11_ = auVar132._0_11_;
      auVar137[0xb] = UVar10;
      auVar136._11_5_ = auVar137._11_5_;
      auVar136._0_10_ = auVar132._0_10_;
      auVar136[10] = auVar132[5];
      auVar135._10_6_ = auVar136._10_6_;
      auVar135._0_9_ = auVar132._0_9_;
      auVar135[9] = UVar9;
      auVar134._9_7_ = auVar135._9_7_;
      auVar134._0_8_ = auVar132._0_8_;
      auVar134[8] = auVar132[4];
      auVar133._8_8_ = auVar134._8_8_;
      auVar133[7] = UVar8;
      auVar133[6] = auVar132[3];
      auVar133[5] = UVar7;
      auVar133[4] = auVar132[2];
      auVar133[3] = UVar6;
      auVar133[2] = auVar132[1];
      auVar133[0] = auVar132[0];
      auVar133[1] = UVar5;
      auVar141 = pmaddubsw(auVar133,auVar63);
      auVar104._0_2_ = sVar76 + 0x200;
      auVar104._2_2_ = sVar81 + 0x200;
      auVar104._4_2_ = sVar83 + 0x200;
      auVar104._6_2_ = sVar85 + 0x200;
      auVar104._8_2_ = sVar25 + 0x200;
      auVar104._10_2_ = sVar26 + 0x200;
      auVar104._12_2_ = sVar27 + 0x200;
      auVar104._14_2_ = sVar28 + 0x200;
      auVar153._0_14_ = auVar145._0_14_;
      auVar153[0xe] = auVar145[7];
      auVar153[0xf] = UVar12;
      auVar152._14_2_ = auVar153._14_2_;
      auVar152._0_13_ = auVar145._0_13_;
      auVar152[0xd] = UVar11;
      auVar151._13_3_ = auVar152._13_3_;
      auVar151._0_12_ = auVar145._0_12_;
      auVar151[0xc] = auVar145[6];
      auVar150._12_4_ = auVar151._12_4_;
      auVar150._0_11_ = auVar145._0_11_;
      auVar150[0xb] = UVar10;
      auVar149._11_5_ = auVar150._11_5_;
      auVar149._0_10_ = auVar145._0_10_;
      auVar149[10] = auVar145[5];
      auVar148._10_6_ = auVar149._10_6_;
      auVar148._0_9_ = auVar145._0_9_;
      auVar148[9] = UVar9;
      auVar147._9_7_ = auVar148._9_7_;
      auVar147._0_8_ = auVar145._0_8_;
      auVar147[8] = auVar145[4];
      auVar146._8_8_ = auVar147._8_8_;
      auVar146[7] = UVar8;
      auVar146[6] = auVar145[3];
      auVar146[5] = UVar7;
      auVar146[4] = auVar145[2];
      auVar146[3] = UVar6;
      auVar146[2] = auVar145[1];
      auVar146[0] = auVar145[0];
      auVar146[1] = UVar5;
      auVar154 = pmaddubsw(auVar146,auVar73);
      auVar64._0_2_ = sVar62 + -0x300;
      auVar64._2_2_ = sVar66 + -0x300;
      auVar64._4_2_ = sVar67 + -0x300;
      auVar64._6_2_ = sVar68 + -0x300;
      auVar64._8_2_ = sVar69 + -0x300;
      auVar64._10_2_ = sVar70 + -0x300;
      auVar64._12_2_ = sVar71 + -0x300;
      auVar64._14_2_ = sVar72 + -0x300;
      auVar120._0_14_ = auVar112._0_14_;
      auVar120[0xe] = auVar112[7];
      auVar120[0xf] = UVar12;
      auVar119._14_2_ = auVar120._14_2_;
      auVar119._0_13_ = auVar112._0_13_;
      auVar119[0xd] = UVar11;
      auVar118._13_3_ = auVar119._13_3_;
      auVar118._0_12_ = auVar112._0_12_;
      auVar118[0xc] = auVar112[6];
      auVar117._12_4_ = auVar118._12_4_;
      auVar117._0_11_ = auVar112._0_11_;
      auVar117[0xb] = UVar10;
      auVar116._11_5_ = auVar117._11_5_;
      auVar116._0_10_ = auVar112._0_10_;
      auVar116[10] = auVar112[5];
      auVar115._10_6_ = auVar116._10_6_;
      auVar115._0_9_ = auVar112._0_9_;
      auVar115[9] = UVar9;
      auVar114._9_7_ = auVar115._9_7_;
      auVar114._0_8_ = auVar112._0_8_;
      auVar114[8] = auVar112[4];
      auVar113._8_8_ = auVar114._8_8_;
      auVar113[7] = UVar8;
      auVar113[6] = auVar112[3];
      auVar113[5] = UVar7;
      auVar113[4] = auVar112[2];
      auVar113[3] = UVar6;
      auVar113[2] = auVar112[1];
      auVar113[0] = auVar112[0];
      auVar113[1] = UVar5;
      auVar45._0_14_ = auVar22._0_14_;
      auVar45[0xe] = auVar22[7];
      auVar45[0xf] = UVar12;
      auVar44._14_2_ = auVar45._14_2_;
      auVar44._0_13_ = auVar22._0_13_;
      auVar44[0xd] = UVar11;
      auVar43._13_3_ = auVar44._13_3_;
      auVar43._0_12_ = auVar22._0_12_;
      auVar43[0xc] = auVar22[6];
      auVar42._12_4_ = auVar43._12_4_;
      auVar42._0_11_ = auVar22._0_11_;
      auVar42[0xb] = UVar10;
      auVar41._11_5_ = auVar42._11_5_;
      auVar41._0_10_ = auVar22._0_10_;
      auVar41[10] = auVar22[5];
      auVar40._10_6_ = auVar41._10_6_;
      auVar40._0_9_ = auVar22._0_9_;
      auVar40[9] = UVar9;
      auVar39._9_7_ = auVar40._9_7_;
      auVar39._0_8_ = auVar22._0_8_;
      auVar39[8] = auVar22[4];
      auVar38._8_8_ = auVar39._8_8_;
      auVar38[7] = UVar8;
      auVar38[6] = auVar22[3];
      auVar38[5] = UVar7;
      auVar38[4] = auVar22[2];
      auVar38[3] = UVar6;
      auVar38[2] = auVar22[1];
      auVar38[0] = auVar22[0];
      auVar38[1] = UVar5;
      auVar77._0_2_ = sVar76 + 0x300;
      auVar77._2_2_ = sVar81 + 0x300;
      auVar77._4_2_ = sVar83 + 0x300;
      auVar77._6_2_ = sVar85 + 0x300;
      auVar77._8_2_ = sVar25 + 0x300;
      auVar77._10_2_ = sVar26 + 0x300;
      auVar77._12_2_ = sVar27 + 0x300;
      auVar77._14_2_ = sVar28 + 0x300;
      auVar112 = pmaddubsw(auVar38,auVar64);
      auVar145 = pmaddubsw(auVar29,auVar23);
      auVar132 = pmaddubsw(auVar29,auVar104);
      auVar22 = pmaddubsw(auVar29,auVar77);
      auVar78 = pmaddubsw(auVar29,auVar31);
      auVar121 = pmaddubsw(auVar113,auVar30);
      uVar75 = (ushort)(auVar78._0_2_ + local_28 + auVar121._0_2_) >> 4;
      uVar80 = (ushort)(auVar78._2_2_ + sStack_26 + auVar121._2_2_) >> 4;
      uVar82 = (ushort)(auVar78._4_2_ + local_28 + auVar121._4_2_) >> 4;
      uVar84 = (ushort)(auVar78._6_2_ + sStack_26 + auVar121._6_2_) >> 4;
      uVar86 = (ushort)(auVar78._8_2_ + local_28 + auVar121._8_2_) >> 4;
      uVar87 = (ushort)(auVar78._10_2_ + sStack_26 + auVar121._10_2_) >> 4;
      uVar88 = (ushort)(auVar78._12_2_ + local_28 + auVar121._12_2_) >> 4;
      uVar89 = (ushort)(auVar78._14_2_ + sStack_26 + auVar121._14_2_) >> 4;
      *(ulong *)pu1_dst =
           CONCAT17((uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89),
                    CONCAT16((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                             CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 -
                                      (0xff < uVar87),
                                      CONCAT14((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                               (0xff < uVar86),
                                               CONCAT13((uVar84 != 0) * (uVar84 < 0x100) *
                                                        (char)uVar84 - (0xff < uVar84),
                                                        CONCAT12((uVar82 != 0) * (uVar82 < 0x100) *
                                                                 (char)uVar82 - (0xff < uVar82),
                                                                 CONCAT11((uVar80 != 0) *
                                                                          (uVar80 < 0x100) *
                                                                          (char)uVar80 -
                                                                          (0xff < uVar80),
                                                                          (uVar75 != 0) *
                                                                          (uVar75 < 0x100) *
                                                                          (char)uVar75 -
                                                                          (0xff < uVar75))))))));
      uVar75 = (ushort)(auVar145._0_2_ + local_28 + auVar141._0_2_) >> 4;
      uVar80 = (ushort)(auVar145._2_2_ + sStack_26 + auVar141._2_2_) >> 4;
      uVar82 = (ushort)(auVar145._4_2_ + local_28 + auVar141._4_2_) >> 4;
      uVar84 = (ushort)(auVar145._6_2_ + sStack_26 + auVar141._6_2_) >> 4;
      uVar86 = (ushort)(auVar145._8_2_ + local_28 + auVar141._8_2_) >> 4;
      uVar87 = (ushort)(auVar145._10_2_ + sStack_26 + auVar141._10_2_) >> 4;
      uVar88 = (ushort)(auVar145._12_2_ + local_28 + auVar141._12_2_) >> 4;
      uVar89 = (ushort)(auVar145._14_2_ + sStack_26 + auVar141._14_2_) >> 4;
      *(ulong *)(pu1_dst + lVar14) =
           CONCAT17((uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89),
                    CONCAT16((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                             CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 -
                                      (0xff < uVar87),
                                      CONCAT14((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                               (0xff < uVar86),
                                               CONCAT13((uVar84 != 0) * (uVar84 < 0x100) *
                                                        (char)uVar84 - (0xff < uVar84),
                                                        CONCAT12((uVar82 != 0) * (uVar82 < 0x100) *
                                                                 (char)uVar82 - (0xff < uVar82),
                                                                 CONCAT11((uVar80 != 0) *
                                                                          (uVar80 < 0x100) *
                                                                          (char)uVar80 -
                                                                          (0xff < uVar80),
                                                                          (uVar75 != 0) *
                                                                          (uVar75 < 0x100) *
                                                                          (char)uVar75 -
                                                                          (0xff < uVar75))))))));
      uVar75 = (ushort)(auVar132._0_2_ + local_28 + auVar154._0_2_) >> 4;
      uVar80 = (ushort)(auVar132._2_2_ + sStack_26 + auVar154._2_2_) >> 4;
      uVar82 = (ushort)(auVar132._4_2_ + local_28 + auVar154._4_2_) >> 4;
      uVar84 = (ushort)(auVar132._6_2_ + sStack_26 + auVar154._6_2_) >> 4;
      uVar86 = (ushort)(auVar132._8_2_ + local_28 + auVar154._8_2_) >> 4;
      uVar87 = (ushort)(auVar132._10_2_ + sStack_26 + auVar154._10_2_) >> 4;
      uVar88 = (ushort)(auVar132._12_2_ + local_28 + auVar154._12_2_) >> 4;
      uVar89 = (ushort)(auVar132._14_2_ + sStack_26 + auVar154._14_2_) >> 4;
      *(ulong *)(pu1_dst + lVar14 * 2) =
           CONCAT17((uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89),
                    CONCAT16((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                             CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 -
                                      (0xff < uVar87),
                                      CONCAT14((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                               (0xff < uVar86),
                                               CONCAT13((uVar84 != 0) * (uVar84 < 0x100) *
                                                        (char)uVar84 - (0xff < uVar84),
                                                        CONCAT12((uVar82 != 0) * (uVar82 < 0x100) *
                                                                 (char)uVar82 - (0xff < uVar82),
                                                                 CONCAT11((uVar80 != 0) *
                                                                          (uVar80 < 0x100) *
                                                                          (char)uVar80 -
                                                                          (0xff < uVar80),
                                                                          (uVar75 != 0) *
                                                                          (uVar75 < 0x100) *
                                                                          (char)uVar75 -
                                                                          (0xff < uVar75))))))));
      uVar75 = (ushort)(auVar22._0_2_ + local_28 + auVar112._0_2_) >> 4;
      uVar80 = (ushort)(auVar22._2_2_ + sStack_26 + auVar112._2_2_) >> 4;
      uVar82 = (ushort)(auVar22._4_2_ + local_28 + auVar112._4_2_) >> 4;
      uVar84 = (ushort)(auVar22._6_2_ + sStack_26 + auVar112._6_2_) >> 4;
      uVar86 = (ushort)(auVar22._8_2_ + local_28 + auVar112._8_2_) >> 4;
      uVar87 = (ushort)(auVar22._10_2_ + sStack_26 + auVar112._10_2_) >> 4;
      uVar88 = (ushort)(auVar22._12_2_ + local_28 + auVar112._12_2_) >> 4;
      uVar89 = (ushort)(auVar22._14_2_ + sStack_26 + auVar112._14_2_) >> 4;
      *(ulong *)(pu1_dst + lVar14 * 3) =
           CONCAT17((uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89),
                    CONCAT16((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                             CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 -
                                      (0xff < uVar87),
                                      CONCAT14((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                               (0xff < uVar86),
                                               CONCAT13((uVar84 != 0) * (uVar84 < 0x100) *
                                                        (char)uVar84 - (0xff < uVar84),
                                                        CONCAT12((uVar82 != 0) * (uVar82 < 0x100) *
                                                                 (char)uVar82 - (0xff < uVar82),
                                                                 CONCAT11((uVar80 != 0) *
                                                                          (uVar80 < 0x100) *
                                                                          (char)uVar80 -
                                                                          (0xff < uVar80),
                                                                          (uVar75 != 0) *
                                                                          (uVar75 < 0x100) *
                                                                          (char)uVar75 -
                                                                          (0xff < uVar75))))))));
      auVar30._0_2_ = sVar62 + -0x400;
      auVar30._2_2_ = sVar66 + -0x400;
      auVar30._4_2_ = sVar67 + -0x400;
      auVar30._6_2_ = sVar68 + -0x400;
      auVar30._8_2_ = sVar69 + -0x400;
      auVar30._10_2_ = sVar70 + -0x400;
      auVar30._12_2_ = sVar71 + -0x400;
      auVar30._14_2_ = sVar72 + -0x400;
      auVar31._0_2_ = sVar76 + 0x400;
      auVar31._2_2_ = sVar81 + 0x400;
      auVar31._4_2_ = sVar83 + 0x400;
      auVar31._6_2_ = sVar85 + 0x400;
      auVar31._8_2_ = sVar25 + 0x400;
      auVar31._10_2_ = sVar26 + 0x400;
      auVar31._12_2_ = sVar27 + 0x400;
      auVar31._14_2_ = sVar28 + 0x400;
      pu1_dst = pu1_dst + lVar14 * 4;
      pbVar16 = pbVar16 + -4;
      uVar15 = uVar15 - 4;
    }
  }
  else {
    uVar15 = nt - 1;
    auVar22 = pshuflw(ZEXT416(uVar15),ZEXT416(uVar15),0);
    auVar29 = pshuflw(ZEXT116(bVar3),ZEXT116(bVar3),0);
    uVar19 = 0;
    uVar18 = (ulong)(uint)nt;
    if (nt < 1) {
      uVar18 = uVar19;
    }
    auVar112 = pmovsxbw(in_XMM2,0x807060504030201);
    auVar132 = pmovsxbw(in_XMM3,0xfcfcfcfcfcfcfcfc);
    auVar145 = pmovsxbw(in_XMM4,0x404040404040404);
    while (uVar19 != uVar18) {
      uVar17 = (uint)uVar19;
      auVar78 = pshuflw(ZEXT116(pu1_ref[(int)(~uVar17 + uVar4)]),
                        ZEXT116(pu1_ref[(int)(~uVar17 + uVar4)]),0);
      uVar19 = uVar19 + 1;
      auVar121 = ZEXT416(uVar15 - uVar17);
      auVar121 = pshuflw(auVar121,auVar121,0);
      auVar141 = ZEXT416((int)uVar19 * (uint)bVar2 + nt);
      auVar141 = pshuflw(auVar141,auVar141,0);
      auVar93 = auVar112;
      sVar76 = auVar22._0_2_;
      sVar81 = auVar22._2_2_ + -1;
      sVar83 = auVar22._0_2_ + -2;
      sVar85 = auVar22._2_2_ + -3;
      for (lVar20 = 0; lVar20 < lVar14; lVar20 = lVar20 + 4) {
        auVar154 = pmovzxbw(in_XMM10,*(undefined8 *)(pu1_ref + lVar20 + (long)(int)uVar4 + 1));
        sVar25 = auVar121._0_2_;
        in_XMM10._0_2_ = auVar154._0_2_ * sVar25;
        sVar26 = auVar121._2_2_;
        in_XMM10._2_2_ = auVar154._2_2_ * sVar26;
        in_XMM10._4_2_ = auVar154._4_2_ * sVar25;
        in_XMM10._6_2_ = auVar154._6_2_ * sVar26;
        in_XMM10._8_2_ = auVar154._8_2_ * sVar25;
        in_XMM10._10_2_ = auVar154._10_2_ * sVar26;
        in_XMM10._12_2_ = auVar154._12_2_ * sVar25;
        in_XMM10._14_2_ = auVar154._14_2_ * sVar26;
        sVar25 = auVar93._2_2_;
        sVar26 = auVar93._4_2_;
        sVar27 = auVar93._6_2_;
        sVar28 = auVar93._8_2_;
        sVar62 = auVar93._10_2_;
        sVar66 = auVar93._12_2_;
        sVar67 = auVar93._14_2_;
        uVar75 = (ushort)(sVar76 * auVar78._0_2_ + auVar141._0_2_ + auVar93._0_2_ * auVar29._0_2_ +
                         in_XMM10._0_2_) >> 3;
        uVar80 = (ushort)(sVar81 * auVar78._2_2_ + auVar141._2_2_ + sVar25 * auVar29._2_2_ +
                         in_XMM10._2_2_) >> 3;
        uVar82 = (ushort)(sVar83 * auVar78._0_2_ + auVar141._0_2_ + sVar26 * auVar29._0_2_ +
                         in_XMM10._4_2_) >> 3;
        uVar84 = (ushort)(sVar85 * auVar78._2_2_ + auVar141._2_2_ + sVar27 * auVar29._2_2_ +
                         in_XMM10._6_2_) >> 3;
        *(uint *)(pu1_dst + lVar20) =
             CONCAT13((uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84),
                      CONCAT12((uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 - (0xff < uVar82),
                               CONCAT11((uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 -
                                        (0xff < uVar80),
                                        (uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 -
                                        (0xff < uVar75))));
        sVar76 = sVar76 + auVar132._0_2_;
        sVar81 = sVar81 + auVar132._2_2_;
        sVar83 = sVar83 + auVar132._4_2_;
        sVar85 = sVar85 + auVar132._6_2_;
        auVar93._0_2_ = auVar93._0_2_ + auVar145._0_2_;
        auVar93._2_2_ = sVar25 + auVar145._2_2_;
        auVar93._4_2_ = sVar26 + auVar145._4_2_;
        auVar93._6_2_ = sVar27 + auVar145._6_2_;
        auVar93._8_2_ = sVar28 + auVar145._8_2_;
        auVar93._10_2_ = sVar62 + auVar145._10_2_;
        auVar93._12_2_ = sVar66 + auVar145._12_2_;
        auVar93._14_2_ = sVar67 + auVar145._14_2_;
      }
      pu1_dst = pu1_dst + dst_strd;
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_planar_ssse3(UWORD8 *pu1_ref,
                                        WORD32 src_strd,
                                        UWORD8 *pu1_dst,
                                        WORD32 dst_strd,
                                        WORD32 nt,
                                        WORD32 mode)
{


    WORD32 row, col;
    WORD32 two_nt, three_nt;
    UWORD16 temp;

    __m128i pu1_ref_16x8b, const_temp_4x32b, const_temp1_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i col_8x16b, const_temp5_4x32b, const_temp6_4x32b, zero_8x16b, const_temp7_4x32b, const_temp8_4x32b;
    __m128i nt_row_16x8b, nt_row1_16x8b, nt_row2_16x8b, nt_row3_16x8b; //nt-1-row
    __m128i row_16x8b, row1_16x8b, row2_16x8b, row3_16x8b; //row+1
    UNUSED(src_strd);
    UNUSED(mode);

    two_nt = 2 * nt;
    three_nt = 3 * nt;

    /* Planar filtering */
    temp = pu1_ref[nt - 1];
    temp = (temp << 8) | ((UWORD16)pu1_ref[three_nt + 1]);
    /* setting vallues in  registera*/
    pu1_ref_16x8b  = _mm_set1_epi16(temp);
    const_temp6_4x32b = _mm_set1_epi16(nt);



    if(nt == 32) /* for nt multiple of 8*/
    {


        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        const_temp8_4x32b = _mm_set1_epi16(0x0008);
        //(nt-1-y) (nt-1-x) ; x= 0..15 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x1f18, 0x1f19, 0x1f1a, 0x1f1b, 0x1f1c, 0x1f1d, 0x1f1e, 0x1f1f);
        //(y+1) (x+1) ; x= 0..15 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 1)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b, src_temp1_8x16b;


            res_temp1_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);

            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp8_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp8_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp8_4x32b);
            row2_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp8_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row2_16x8b, const_temp8_4x32b);
            row3_16x8b    = _mm_add_epi16(row2_16x8b,    const_temp8_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 17));

            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp1_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp1_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 6); //log2(32)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 6);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 6);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 6);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, res_temp1_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp2_8x16b, res_temp3_8x16b);


            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd) + 16), res_temp1_8x16b);


            nt_row_16x8b = _mm_sub_epi16(nt_row_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row_16x8b,    const_temp1_4x32b);
        }
    }
    else if(nt == 16) /* for nt multiple of 8*/
    {

        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        const_temp8_4x32b = _mm_set1_epi16(0x0008);
        //(nt-1-y) (nt-1-x) ; x= 0..15 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x0f08, 0x0f09, 0x0f0a, 0x0f0b, 0x0f0c, 0x0f0d, 0x0f0e, 0x0f0f);
        //(y+1) (x+1) ; x= 0..15 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 2)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b;


            res_temp1_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);
            res_temp2_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 2 - row]);


            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp1_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp1_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp8_4x32b);
            row2_16x8b    = _mm_add_epi16(row_16x8b,     const_temp8_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp8_4x32b);
            row3_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp8_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));


            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpacklo_epi8(res_temp2_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpackhi_epi8(res_temp2_8x16b, src_temp_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 5); //log2(16)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 5);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 5);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 5);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, res_temp2_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, res_temp3_8x16b);

            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), res_temp1_8x16b);

            nt_row_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp1_4x32b);
        }
    }
    else if(nt == 8)
    {


        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        zero_8x16b = _mm_set1_epi32(0);

        //(nt-1-y) (nt-1-x) ; x= 0..7 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x0700, 0x0701, 0x0702, 0x0703, 0x0704, 0x0705, 0x0706, 0x0707);
        //(y+1) (x+1) ; x= 0..7 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 4)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b;


            res_temp4_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);
            res_temp5_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 2 - row]);
            res_temp6_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 3 - row]);
            res_temp7_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 4 - row]);

            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp1_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp1_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp1_4x32b);
            row2_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp1_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row2_16x8b, const_temp1_4x32b);
            row3_16x8b    = _mm_add_epi16(row2_16x8b,    const_temp1_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp4_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpacklo_epi8(res_temp5_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpacklo_epi8(res_temp6_8x16b, src_temp_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpacklo_epi8(res_temp7_8x16b, src_temp_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 4); //log2(16)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 4);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 4);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 4);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, zero_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);
            res_temp2_8x16b = _mm_packus_epi16(res_temp2_8x16b, zero_8x16b);
            res_temp3_8x16b = _mm_packus_epi16(res_temp3_8x16b, zero_8x16b);

            _mm_storel_epi64((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), res_temp1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), res_temp2_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), res_temp3_8x16b);

            nt_row_16x8b = _mm_sub_epi16(nt_row3_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row3_16x8b,    const_temp1_4x32b);
        }
    }
    else
    {

        /* for nt multiple of 4*/
        const_temp7_4x32b = _mm_set1_epi16(4);
        const_temp4_4x32b = _mm_set1_epi16(nt - 1);
        const_temp_4x32b  = _mm_set1_epi16(pu1_ref[three_nt + 1]);
        const_temp1_4x32b = _mm_set1_epi16(pu1_ref[nt - 1]);
        zero_8x16b = _mm_set1_epi32(0);

        for(row = 0; row < nt; row++)
        {
            __m128i res_temp_8x16b, row_8x16b, res_temp1_8x16b, res_temp2_8x16b;
            __m128i res_temp3_8x16b;

            const_temp2_4x32b  = _mm_set1_epi16(pu1_ref[two_nt - 1 - row]);
            const_temp3_4x32b  = _mm_set1_epi16((row + 1));


            row_8x16b = _mm_set1_epi16((nt - 1 - row));

            const_temp5_4x32b = _mm_set_epi16(7, 6, 5, 4, 3, 2, 1, 0);
            col_8x16b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);

            const_temp5_4x32b = _mm_sub_epi16(const_temp4_4x32b, const_temp5_4x32b);

            /*(row + 1) * pu1_ref[nt - 1]*/
            res_temp_8x16b  = _mm_mullo_epi16(const_temp3_4x32b,  const_temp1_4x32b);

            /*(row + 1) * pu1_ref[nt - 1] + nt)*/
            res_temp_8x16b = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);

            for(col = 0; col < nt; col += 4)
            {
                __m128i src_temp_8x16b;
                int temp1;

                /* loding 8bit 16 pixles*/
                src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + col));

                src_temp_8x16b =  _mm_unpacklo_epi8(src_temp_8x16b, zero_8x16b); /* row=0*/

                /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] */
                res_temp1_8x16b  = _mm_mullo_epi16(src_temp_8x16b,  row_8x16b);

                /*(col + 1) * pu1_ref[three_nt + 1]*/
                res_temp2_8x16b  = _mm_mullo_epi16(const_temp_4x32b,  col_8x16b);

                /*(nt - 1 - col)* pu1_ref[two_nt - 1 - row]*/
                res_temp3_8x16b  = _mm_mullo_epi16(const_temp2_4x32b,  const_temp5_4x32b);

                res_temp1_8x16b = _mm_add_epi16(res_temp_8x16b, res_temp1_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp3_8x16b);

                res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 3); //log2(16)+1
                res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);

                temp1 = _mm_cvtsi128_si32(res_temp1_8x16b);

                *(WORD32 *)(&pu1_dst[(row * dst_strd) + col]) = temp1;

                const_temp5_4x32b = _mm_sub_epi16(const_temp5_4x32b, const_temp7_4x32b);
                col_8x16b = _mm_add_epi16(col_8x16b, const_temp7_4x32b);
            } /* inner loop ends here */
        }
    }


}